

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# estring.cpp
# Opt level: O3

Vec4f __thiscall embree::string_to_Vec4f(embree *this,string *str)

{
  char *pcVar1;
  int *piVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined4 extraout_XMM0_Db;
  undefined8 uVar8;
  Vec4f VVar9;
  char *local_50 [2];
  char local_40 [16];
  
  pcVar1 = (str->_M_dataplus)._M_p;
  piVar2 = __errno_location();
  iVar3 = *piVar2;
  *piVar2 = 0;
  fVar4 = strtof(pcVar1,local_50);
  if (local_50[0] == pcVar1) {
    std::__throw_invalid_argument("stof");
LAB_001dbd87:
    std::__throw_out_of_range("stof");
LAB_001dbd93:
    std::__throw_invalid_argument("stof");
LAB_001dbd9f:
    std::__throw_out_of_range("stof");
LAB_001dbdab:
    std::__throw_invalid_argument("stof");
  }
  else {
    if (*piVar2 == 0x22) goto LAB_001dbd87;
    if (*piVar2 == 0) {
      *piVar2 = iVar3;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    std::__cxx11::string::operator=((string *)str,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    pcVar1 = (str->_M_dataplus)._M_p;
    iVar3 = *piVar2;
    *piVar2 = 0;
    fVar5 = strtof(pcVar1,local_50);
    if (local_50[0] == pcVar1) goto LAB_001dbd93;
    if (*piVar2 == 0x22) goto LAB_001dbd9f;
    if (*piVar2 == 0) {
      *piVar2 = iVar3;
    }
    std::__cxx11::string::substr((ulong)local_50,(ulong)str);
    std::__cxx11::string::operator=((string *)str,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    pcVar1 = (str->_M_dataplus)._M_p;
    iVar3 = *piVar2;
    *piVar2 = 0;
    fVar6 = strtof(pcVar1,local_50);
    if (local_50[0] == pcVar1) goto LAB_001dbdab;
    if (*piVar2 != 0x22) {
      if (*piVar2 == 0) {
        *piVar2 = iVar3;
      }
      std::__cxx11::string::substr((ulong)local_50,(ulong)str);
      std::__cxx11::string::operator=((string *)str,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      pcVar1 = (str->_M_dataplus)._M_p;
      iVar3 = *piVar2;
      *piVar2 = 0;
      fVar7 = strtof(pcVar1,local_50);
      uVar8 = CONCAT44(extraout_XMM0_Db,fVar7);
      if (local_50[0] != pcVar1) {
        if (*piVar2 != 0) {
          if (*piVar2 != 0x22) goto LAB_001dbd40;
          uVar8 = std::__throw_out_of_range("stof");
        }
        *piVar2 = iVar3;
LAB_001dbd40:
        *(float *)this = fVar4;
        *(float *)(this + 4) = fVar5;
        *(float *)(this + 8) = fVar6;
        *(int *)(this + 0xc) = (int)uVar8;
        VVar9.field_0.field_0.z = fVar6;
        VVar9.field_0._0_8_ = uVar8;
        VVar9.field_0.field_0.w = 0.0;
        return (Vec4f)VVar9.field_0;
      }
      goto LAB_001dbdc3;
    }
  }
  std::__throw_out_of_range("stof");
LAB_001dbdc3:
  uVar8 = std::__throw_invalid_argument("stof");
  if (*piVar2 == 0) {
    *piVar2 = iVar3;
  }
  _Unwind_Resume(uVar8);
}

Assistant:

Vec4f string_to_Vec4f ( std::string str )
  {
    size_t next = 0;
    const float x = std::stof(str,&next); str = str.substr(next+1);
    const float y = std::stof(str,&next); str = str.substr(next+1);
    const float z = std::stof(str,&next); str = str.substr(next+1);
    const float w = std::stof(str,&next);
    return Vec4f(x,y,z,w);
  }